

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

size_t lha_check_header_format(void *h)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = *(byte *)((long)h + 5);
  uVar2 = (uint)bVar1;
  if (bVar1 < 100) {
    if (7 < bVar1 - 0x30) {
      if (uVar2 != 0x2d) {
        return 4;
      }
      return 3;
    }
  }
  else if (bVar1 < 0x6c) {
    if (bVar1 != 100) {
      if (bVar1 == 0x68) {
        return 1;
      }
      return 4;
    }
  }
  else {
    if (bVar1 == 0x6c) {
      return 2;
    }
    if (bVar1 == 0x7a) {
      return 1;
    }
    if (uVar2 != 0x73) {
      return 4;
    }
  }
  if ((((*h != '\0') && (*(char *)((long)h + 2) == '-')) && (*(char *)((long)h + 3) == 'l')) &&
     (*(char *)((long)h + 6) == '-')) {
    if (*(char *)((long)h + 4) == 'z') {
      if (((*(char *)((long)h + 0x14) == '\0') && (uVar2 - 0x34 < 0x40)) &&
         ((0x8000000000000003U >> ((ulong)(uVar2 - 0x34) & 0x3f) & 1) != 0)) {
        return 0;
      }
    }
    else if (((*(char *)((long)h + 4) == 'h') && (uVar2 != 0x73)) &&
            ((*(byte *)((long)h + 0x14) == 0 ||
             ((*(byte *)((long)h + 0x14) < 4 && (*(char *)((long)h + 0x13) == ' ')))))) {
      return 0;
    }
  }
  return 4;
}

Assistant:

static size_t
lha_check_header_format(const void *h)
{
	const unsigned char *p = h;
	size_t next_skip_bytes;

	switch (p[H_METHOD_OFFSET+3]) {
	/*
	 * "-lh0-" ... "-lh7-" "-lhd-"
	 * "-lzs-" "-lz5-"
	 */
	case '0': case '1': case '2': case '3':
	case '4': case '5': case '6': case '7':
	case 'd':
	case 's':
		next_skip_bytes = 4;

		/* b0 == 0 means the end of an LHa archive file.	*/
		if (p[0] == 0)
			break;
		if (p[H_METHOD_OFFSET] != '-' || p[H_METHOD_OFFSET+1] != 'l'
		    ||  p[H_METHOD_OFFSET+4] != '-')
			break;

		if (p[H_METHOD_OFFSET+2] == 'h') {
			/* "-lh?-" */
			if (p[H_METHOD_OFFSET+3] == 's')
				break;
			if (p[H_LEVEL_OFFSET] == 0)
				return (0);
			if (p[H_LEVEL_OFFSET] <= 3 && p[H_ATTR_OFFSET] == 0x20)
				return (0);
		}
		if (p[H_METHOD_OFFSET+2] == 'z') {
			/* LArc extensions: -lzs-,-lz4- and -lz5- */
			if (p[H_LEVEL_OFFSET] != 0)
				break;
			if (p[H_METHOD_OFFSET+3] == 's'
			    || p[H_METHOD_OFFSET+3] == '4'
			    || p[H_METHOD_OFFSET+3] == '5')
				return (0);
		}
		break;
	case 'h': next_skip_bytes = 1; break;
	case 'z': next_skip_bytes = 1; break;
	case 'l': next_skip_bytes = 2; break;
	case '-': next_skip_bytes = 3; break;
	default : next_skip_bytes = 4; break;
	}

	return (next_skip_bytes);
}